

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O3

void __thiscall
duckdb::SumRewriterOptimizer::VisitOperator(SumRewriterOptimizer *this,LogicalOperator *op)

{
  uint uVar1;
  SumRewriterOptimizer sum_rewriter;
  SumRewriterOptimizer local_60;
  
  uVar1 = op->type - 0x4b;
  if (((4 < uVar1) || (uVar1 == 3)) && (op->type != LOGICAL_PROJECTION)) {
    StandardVisitOperator(this,op);
    return;
  }
  SumRewriterOptimizer(&local_60,this->optimizer);
  StandardVisitOperator(&local_60,op);
  ~SumRewriterOptimizer(&local_60);
  return;
}

Assistant:

void SumRewriterOptimizer::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		SumRewriterOptimizer sum_rewriter(optimizer);
		sum_rewriter.StandardVisitOperator(op);
		return;
	}
	default:
		break;
	}

	StandardVisitOperator(op);
}